

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O1

void __thiscall
ScriptCompression::Ser<SizeComputer>(ScriptCompression *this,SizeComputer *s,CScript *script)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long in_FS_OFFSET;
  CompressedScript compr;
  direct_or_indirect local_48;
  uint local_24;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = 0;
  local_48.direct[0x20] = '\0';
  local_24 = 0;
  bVar2 = CompressScript(script,(CompressedScript *)&local_48.indirect_contents);
  if (bVar2) {
    uVar5 = local_24 - 0x22;
    if (local_24 < 0x22) {
      uVar5 = local_24;
    }
    uVar3 = (ulong)uVar5;
  }
  else {
    uVar5 = (script->super_CScriptBase)._size;
    uVar1 = uVar5 - 0x1d;
    if (uVar5 < 0x1d) {
      uVar1 = uVar5;
    }
    lVar4 = 1;
    for (uVar5 = uVar1 + 6; 0x7f < uVar5; uVar5 = (uVar5 >> 7) - 1) {
      lVar4 = lVar4 + 1;
    }
    uVar3 = (ulong)uVar1 + lVar4;
  }
  s->nSize = uVar3 + s->nSize;
  if (0x21 < local_24) {
    free(local_48.indirect_contents.indirect);
    local_48.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }